

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

ObjTypeSpecFldInfo * __thiscall Func::GetGlobalObjTypeSpecFldInfo(Func *this,uint propertyInfoId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Func *pFVar4;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar5;
  uint propertyInfoId_local;
  Func *this_local;
  
  pFVar4 = GetTopFunc(this);
  this_00 = GetWorkItem(pFVar4);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this_00);
  uVar3 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(this_01);
  if (uVar3 <= propertyInfoId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x60b,
                       "(propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount())"
                       ,
                       "propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetTopFunc(this);
  return pFVar4->m_globalObjTypeSpecFldInfoArray[propertyInfoId];
}

Assistant:

ObjTypeSpecFldInfo*
Func::GetGlobalObjTypeSpecFldInfo(uint propertyInfoId) const
{
    Assert(propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
    return GetTopFunc()->m_globalObjTypeSpecFldInfoArray[propertyInfoId];
}